

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O0

SMBusByte * __thiscall
SMBusByte::ToDataWord(SMBusByte *this,SMBusByte *sec,SMBusFrameType frame_type)

{
  undefined1 uVar1;
  undefined6 uVar2;
  const_reference pvVar3;
  U8 in_CL;
  undefined4 in_register_00000014;
  SMBusFrameType frame_type_local;
  SMBusByte *sec_local;
  SMBusByte *this_local;
  Frame *f;
  
  Frame::Frame((Frame *)this);
  this[1].value = in_CL;
  pvVar3 = std::vector<SMBusSignalState,_std::allocator<SMBusSignalState>_>::front(&sec->signals);
  uVar1 = *(undefined1 *)((long)&pvVar3->sample_begin + 1);
  uVar2 = *(undefined6 *)((long)&pvVar3->sample_begin + 2);
  this->value = *(undefined1 *)&pvVar3->sample_begin;
  this->is_acked = (bool)uVar1;
  *(undefined6 *)&this->field_0x2 = uVar2;
  pvVar3 = std::vector<SMBusSignalState,_std::allocator<SMBusSignalState>_>::back
                     ((vector<SMBusSignalState,_std::allocator<SMBusSignalState>_> *)
                      ((byte *)CONCAT44(in_register_00000014,frame_type) + 8));
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pvVar3->sample_end;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(ulong)sec->value;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)(this->signals).
                       super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
                       _M_impl.super__Vector_impl_data._M_finish << 8);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)*(byte *)CONCAT44(in_register_00000014,frame_type) |
                (ulong)(this->signals).
                       super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this[1].is_acked = false;
  if ((sec->is_acked & 1U) != 0) {
    this[1].is_acked = (bool)(this[1].is_acked | 1);
  }
  return this;
}

Assistant:

Frame SMBusByte::ToDataWord( const SMBusByte& sec, SMBusFrameType frame_type ) const
{
    Frame f;

    f.mType = frame_type;
    f.mStartingSampleInclusive = signals.front().sample_begin;
    f.mEndingSampleInclusive = sec.signals.back().sample_end;
    f.mData1 = value;
    f.mData1 <<= 8;
    f.mData1 |= sec.value;
    f.mData2 = 0;
    f.mFlags = 0;
    if( is_acked )
        f.mFlags |= F_IsAcked;

    return f;
}